

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

int UnicodeToUTF8(LPCWSTR lpSrcStr,int cchSrc,LPSTR lpDestStr,int cchDest)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool local_4a;
  WCHAR local_42;
  BOOL bHandled;
  int iStack_3c;
  WCHAR wchHighSurrogate;
  DWORD dwSurrogateChar;
  int cchU8;
  LPCWSTR lpWC;
  int cchDest_local;
  LPSTR lpDestStr_local;
  int cchSrc_local;
  LPCWSTR lpSrcStr_local;
  
  iStack_3c = 0;
  local_42 = L'\0';
  _dwSurrogateChar = lpSrcStr;
  lpDestStr_local._4_4_ = cchSrc;
  do {
    local_4a = false;
    if (lpDestStr_local._4_4_ != 0) {
      local_4a = cchDest == 0 || iStack_3c < cchDest;
    }
    iVar4 = lpDestStr_local._4_4_ + -1;
    if (!local_4a) goto LAB_003a63f2;
    bVar1 = false;
    iVar4 = lpDestStr_local._4_4_;
    if ((0xd7ff < (ushort)*_dwSurrogateChar) && ((ushort)*_dwSurrogateChar < 0xdc00)) {
      if (cchDest == 0) {
        iStack_3c = iStack_3c + 3;
      }
      else if (local_42 != L'\0') {
        if (cchDest <= iStack_3c + 2) goto LAB_003a63f2;
        lpDestStr[iStack_3c] = (byte)((int)(uint)(ushort)local_42 >> 0xc) | 0xe0;
        iVar3 = iStack_3c + 2;
        lpDestStr[iStack_3c + 1] = (byte)((int)((ushort)local_42 & 0xfc0) >> 6) | 0x80;
        iStack_3c = iStack_3c + 3;
        lpDestStr[iVar3] = (byte)local_42 & 0x3f | 0x80;
      }
      local_42 = *_dwSurrogateChar;
      bVar1 = true;
    }
    if ((!bVar1) && (local_42 != L'\0')) {
      if (((ushort)*_dwSurrogateChar < 0xdc00) || (0xdfff < (ushort)*_dwSurrogateChar)) {
        if (cchDest != 0) {
          if (cchDest <= iStack_3c + 2) goto LAB_003a63f2;
          lpDestStr[iStack_3c] = (byte)((int)(uint)(ushort)local_42 >> 0xc) | 0xe0;
          iVar3 = iStack_3c + 2;
          lpDestStr[iStack_3c + 1] = (byte)((int)((ushort)local_42 & 0xfc0) >> 6) | 0x80;
          iStack_3c = iStack_3c + 3;
          lpDestStr[iVar3] = (byte)local_42 & 0x3f | 0x80;
        }
      }
      else {
        if (cchDest == 0) {
          iStack_3c = iStack_3c + 1;
        }
        else {
          if (cchDest <= iStack_3c + 3) {
LAB_003a63f2:
            lpDestStr_local._4_4_ = iVar4;
            if (((lpDestStr_local._4_4_ < 0) && (local_42 != L'\0')) && (cchDest != 0)) {
              if (iStack_3c + 2 < cchDest) {
                lpDestStr[iStack_3c] = (byte)((int)(uint)(ushort)local_42 >> 0xc) | 0xe0;
                iVar4 = iStack_3c + 2;
                lpDestStr[iStack_3c + 1] = (byte)((int)((ushort)local_42 & 0xfc0) >> 6) | 0x80;
                iStack_3c = iStack_3c + 3;
                lpDestStr[iVar4] = (byte)local_42 & 0x3f | 0x80;
              }
              else {
                lpDestStr_local._4_4_ = lpDestStr_local._4_4_ + 1;
              }
            }
            if ((cchDest == 0) || (lpDestStr_local._4_4_ < 0)) {
              lpSrcStr_local._4_4_ = iStack_3c;
            }
            else {
              SetLastError(0x7a);
              lpSrcStr_local._4_4_ = 0;
            }
            return lpSrcStr_local._4_4_;
          }
          uVar2 = ((ushort)local_42 - 0xd800) * 0x400 + (uint)(ushort)*_dwSurrogateChar + 0x2400;
          lpDestStr[iStack_3c] = (byte)(uVar2 >> 0x12) | 0xf0;
          lpDestStr[iStack_3c + 1] = (byte)(uVar2 >> 0xc) & 0x3f | 0x80;
          iVar3 = iStack_3c + 3;
          lpDestStr[iStack_3c + 2] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
          iStack_3c = iStack_3c + 4;
          lpDestStr[iVar3] = (byte)uVar2 & 0x3f | 0x80;
        }
        bVar1 = true;
      }
      local_42 = L'\0';
    }
    if (!bVar1) {
      if ((ushort)*_dwSurrogateChar < 0x80) {
        if (cchDest != 0) {
          if (cchDest <= iStack_3c) goto LAB_003a63f2;
          lpDestStr[iStack_3c] = (CHAR)*_dwSurrogateChar;
        }
        iStack_3c = iStack_3c + 1;
      }
      else if ((ushort)*_dwSurrogateChar < 0x800) {
        if (cchDest != 0) {
          if (cchDest <= iStack_3c + 1) goto LAB_003a63f2;
          lpDestStr[iStack_3c] = (byte)((int)(uint)(ushort)*_dwSurrogateChar >> 6) | 0xc0;
          lpDestStr[iStack_3c + 1] = (byte)*_dwSurrogateChar & 0x3f | 0x80;
        }
        iStack_3c = iStack_3c + 2;
      }
      else {
        if (cchDest != 0) {
          if (cchDest <= iStack_3c + 2) goto LAB_003a63f2;
          lpDestStr[iStack_3c] = (byte)((int)(uint)(ushort)*_dwSurrogateChar >> 0xc) | 0xe0;
          lpDestStr[iStack_3c + 1] = (byte)((int)((ushort)*_dwSurrogateChar & 0xfc0) >> 6) | 0x80;
          lpDestStr[iStack_3c + 2] = (byte)*_dwSurrogateChar & 0x3f | 0x80;
        }
        iStack_3c = iStack_3c + 3;
      }
    }
    _dwSurrogateChar = _dwSurrogateChar + 1;
    lpDestStr_local._4_4_ = lpDestStr_local._4_4_ + -1;
  } while( true );
}

Assistant:

int UnicodeToUTF8(
    LPCWSTR lpSrcStr,
    int cchSrc,
    LPSTR lpDestStr,
    int cchDest)
{
    LPCWSTR lpWC = lpSrcStr;
    int     cchU8 = 0;                // # of UTF8 chars generated
    DWORD   dwSurrogateChar;
    WCHAR   wchHighSurrogate = 0;
    BOOL    bHandled;


    while ((cchSrc--) && ((cchDest == 0) || (cchU8 < cchDest)))
    {
        bHandled = FALSE;

        //
        // Check if high surrogate is available
        //
        if ((*lpWC >= HIGH_SURROGATE_START) && (*lpWC <= HIGH_SURROGATE_END))
        {
            if (cchDest)
            {
                // Another high surrogate, then treat the 1st as normal
                // Unicode character.
                if (wchHighSurrogate)
                {
                    if ((cchU8 + 2) < cchDest)
                    {
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
                    }
                    else
                    {
                        // not enough buffer
                        cchSrc++;
                        break;
                    }
                }
            }
            else
            {
                cchU8 += 3;
            }
            wchHighSurrogate = *lpWC;
            bHandled = TRUE;
        }

        if (!bHandled && wchHighSurrogate)
        {
            if ((*lpWC >= LOW_SURROGATE_START) && (*lpWC <= LOW_SURROGATE_END))
            {
                 // wheee, valid surrogate pairs

                 if (cchDest)
                 {
                     if ((cchU8 + 3) < cchDest)
                     {
                         dwSurrogateChar = (((wchHighSurrogate-0xD800) << 10) + (*lpWC - 0xDC00) + 0x10000);

                         lpDestStr[cchU8++] = (UTF8_1ST_OF_4 |
                                               (unsigned char)(dwSurrogateChar >> 18));           // 3 bits from 1st byte

                         lpDestStr[cchU8++] =  (UTF8_TRAIL |
                                                (unsigned char)((dwSurrogateChar >> 12) & 0x3f)); // 6 bits from 2nd byte

                         lpDestStr[cchU8++] = (UTF8_TRAIL |
                                               (unsigned char)((dwSurrogateChar >> 6) & 0x3f));   // 6 bits from 3rd byte

                         lpDestStr[cchU8++] = (UTF8_TRAIL |
                                               (unsigned char)(0x3f & dwSurrogateChar));          // 6 bits from 4th byte
                     }
                     else
                     {
                        // not enough buffer
                        cchSrc++;
                        break;
                     }
                 }
                 else
                 {
                     // we already counted 3 previously (in high surrogate)
                     cchU8 ++;
                 }

                 bHandled = TRUE;
            }
            else
            {
                 // Bad Surrogate pair : ERROR
                 // Just process wchHighSurrogate , and the code below will
                 // process the current code point
                 if (cchDest)
                 {
                     if ((cchU8 + 2) < cchDest)
                     {
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
                     }
                     else
                     {
                        // not enough buffer
                        cchSrc++;
                        break;
                     }
                 }
            }

            wchHighSurrogate = 0;
        }

        if (!bHandled)
        {
            if (*lpWC <= ASCII)
            {
                //
                //  Found ASCII.
                //
                if (cchDest)
                {
                    if (cchU8 < cchDest) 
                    {
                        lpDestStr[cchU8] = (char)*lpWC;
                    } 
                    else 
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                cchU8++;
            }
            else if (*lpWC <= UTF8_2_MAX)
            {
                //
                //  Found 2 byte sequence if < 0x07ff (11 bits).
                //
                if (cchDest)
                {
                    if ((cchU8 + 1) < cchDest)
                    {
                        //
                        //  Use upper 5 bits in first byte.
                        //  Use lower 6 bits in second byte.
                        //
                        lpDestStr[cchU8++] = UTF8_1ST_OF_2 | (*lpWC >> 6);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(*lpWC);
                    }
                    else
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                else
                {
                    cchU8 += 2;
                }
            }
            else
            {
                //
                //  Found 3 byte sequence.
                //
                if (cchDest)
                {
                    if ((cchU8 + 2) < cchDest)
                    {
                        //
                        //  Use upper  4 bits in first byte.
                        //  Use middle 6 bits in second byte.
                        //  Use lower  6 bits in third byte.
                        //
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(*lpWC);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(*lpWC);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(*lpWC);
                    }
                    else
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                else
                {
                    cchU8 += 3;
                }
            }
        }

        lpWC++;
    }

    //
    // If the last character was a high surrogate, then handle it as a normal
    // unicode character.
    //
    if ((cchSrc < 0) && (wchHighSurrogate != 0))
    {
        if (cchDest)
        {
            if ((cchU8 + 2) < cchDest)
            {
                lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
            }
            else
            {
                cchSrc++;
            }
        }
    }

    //
    //  Make sure the destination buffer was large enough.
    //
    if (cchDest && (cchSrc >= 0))
    {
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return (0);
    }

    //
    //  Return the number of UTF-8 characters written.
    //
    return (cchU8);
}